

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGen.cxx
# Opt level: O1

bool __thiscall
cmQtAutoGen::RccLister::list
          (RccLister *this,string *qrcFile,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *files,string *error,bool verbose)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  pointer pbVar3;
  bool bVar4;
  char cVar5;
  int iVar6;
  istream *piVar7;
  long lVar8;
  string *psVar9;
  int *retVal_00;
  char *pcVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  string *entry;
  _Alloc_hider _Var12;
  pointer in_path;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_02;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_03;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_04;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_05;
  string_view text;
  string_view text_00;
  string_view text_01;
  string_view text_02;
  basic_string_view<char,_std::char_traits<char>_> __str;
  string eline;
  string oline;
  int retVal;
  string qrcContents;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cmd;
  string rccStdErr;
  string rccStdOut;
  string fileDir;
  ostringstream osst;
  istringstream ostr;
  string local_4c0;
  string local_4a0;
  int local_46c;
  string *local_468;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_460;
  string local_458;
  undefined1 local_438 [40];
  string local_410;
  string local_3f0;
  string local_3d0;
  undefined1 local_3b0 [32];
  char *local_390;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_388;
  char *local_358;
  ios_base local_340 [64];
  char *local_300;
  char *local_2f0;
  int local_2e8;
  undefined1 local_238 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228;
  char *local_218;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_210;
  char *local_1e0;
  ios_base local_1c0 [56];
  char *local_188;
  char *local_178;
  int local_170;
  
  error->_M_string_length = 0;
  *(error->_M_dataplus)._M_p = '\0';
  psVar9 = error;
  local_460 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)files;
  bVar4 = cmsys::SystemTools::FileExists(qrcFile,true);
  if (!bVar4) {
    text._M_str = (char *)psVar9;
    text._M_len = (size_t)(qrcFile->_M_dataplus)._M_p;
    Quoted_abi_cxx11_(&local_4a0,(cmQtAutoGen *)qrcFile->_M_string_length,text);
    local_238._0_8_ = (pointer)0x12;
    local_238._8_8_ = "The resource file ";
    local_228._M_allocated_capacity = local_4a0._M_string_length;
    local_228._8_8_ = local_4a0._M_dataplus._M_p;
    local_218 = (char *)0x10;
    local_210 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x795ac1;
    views_00._M_len = 3;
    views_00._M_array = (iterator)local_238;
    cmCatViews_abi_cxx11_((string *)local_3b0,views_00);
    std::__cxx11::string::operator=((string *)error,(string *)local_3b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b0._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_3b0 + 0x10)) {
      operator_delete((void *)local_3b0._0_8_,(ulong)(local_3b0._16_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
      operator_delete(local_4a0._M_dataplus._M_p,
                      CONCAT71(local_4a0.field_2._M_allocated_capacity._1_7_,
                               local_4a0.field_2._M_local_buf[0]) + 1);
    }
    return false;
  }
  cmsys::SystemTools::GetFilenamePath(&local_3d0,qrcFile);
  if ((((this->RccExcutable_)._M_string_length == 0) ||
      (bVar4 = cmsys::SystemTools::FileExists(&this->RccExcutable_,true), !bVar4)) ||
     ((this->ListOptions_).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->ListOptions_).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    local_458._M_string_length = 0;
    local_458.field_2._M_local_buf[0] = '\0';
    local_458._M_dataplus._M_p = (pointer)&local_458.field_2;
    std::ifstream::ifstream(local_238,(qrcFile->_M_dataplus)._M_p,_S_in);
    uVar2 = *(uint *)((long)&local_218 + *(long *)(local_238._0_8_ + -0x18));
    if ((uVar2 & 5) == 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b0);
      std::ostream::operator<<(local_3b0,(streambuf *)(local_238 + 0x10));
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=((string *)&local_458,(string *)&local_4a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
        operator_delete(local_4a0._M_dataplus._M_p,
                        CONCAT71(local_4a0.field_2._M_allocated_capacity._1_7_,
                                 local_4a0.field_2._M_local_buf[0]) + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b0);
      std::ios_base::~ios_base(local_340);
    }
    else {
      text_00._M_str = (char *)psVar9;
      text_00._M_len = (size_t)(qrcFile->_M_dataplus)._M_p;
      Quoted_abi_cxx11_(&local_4c0,(cmQtAutoGen *)qrcFile->_M_string_length,text_00);
      local_3b0._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x12;
      local_3b0._8_8_ = "The resource file ";
      local_3b0._16_8_ = local_4c0._M_string_length;
      local_3b0._24_8_ = local_4c0._M_dataplus._M_p;
      local_390 = &DAT_00000011;
      local_388 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x7a63ff;
      views_01._M_len = 3;
      views_01._M_array = (iterator)local_3b0;
      cmCatViews_abi_cxx11_(&local_4a0,views_01);
      std::__cxx11::string::operator=((string *)error,(string *)&local_4a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
        operator_delete(local_4a0._M_dataplus._M_p,
                        CONCAT71(local_4a0.field_2._M_allocated_capacity._1_7_,
                                 local_4a0.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4c0._M_dataplus._M_p != &local_4c0.field_2) {
        operator_delete(local_4c0._M_dataplus._M_p,
                        CONCAT71(local_4c0.field_2._M_allocated_capacity._1_7_,
                                 local_4c0.field_2._M_local_buf[0]) + 1);
      }
    }
    std::ifstream::~ifstream(local_238);
    if ((uVar2 & 5) == 0) {
      local_188 = (char *)0x0;
      local_178 = (char *)0x0;
      local_170 = 0;
      memset((RegularExpression *)local_238,0,0xaa);
      cmsys::RegularExpression::compile((RegularExpression *)local_238,"(<file[^<]+)");
      local_300 = (char *)0x0;
      local_2f0 = (char *)0x0;
      local_2e8 = 0;
      memset((RegularExpression *)local_3b0,0,0xaa);
      cmsys::RegularExpression::compile((RegularExpression *)local_3b0,"(^<file[^>]*>)");
      paVar11 = &local_4c0.field_2;
      _Var12._M_p = local_458._M_dataplus._M_p;
      while (bVar4 = cmsys::RegularExpression::find
                               ((RegularExpression *)local_238,_Var12._M_p,
                                (RegularExpressionMatch *)local_238), bVar4) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._8_8_ ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          local_4a0._M_dataplus._M_p = (pointer)&local_4a0.field_2;
          local_4a0._M_string_length = 0;
          local_4a0.field_2._M_local_buf[0] = '\0';
        }
        else {
          local_4a0._M_dataplus._M_p = (pointer)&local_4a0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_4a0,local_238._8_8_,local_1e0);
        }
        _Var12._M_p = _Var12._M_p + local_4a0._M_string_length;
        cmsys::RegularExpression::find
                  ((RegularExpression *)local_3b0,local_4a0._M_dataplus._M_p,
                   (RegularExpressionMatch *)local_3b0);
        local_4c0._M_dataplus._M_p = (pointer)paVar11;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3b0._8_8_ ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          local_4c0._M_string_length = 0;
          local_4c0.field_2._M_local_buf[0] = '\0';
        }
        else {
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_4c0,local_3b0._8_8_,local_358);
        }
        std::__cxx11::string::substr((ulong)local_438,(ulong)&local_4a0);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  (local_460,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_438);
        if ((pointer)local_438._0_8_ != (pointer)(local_438 + 0x10)) {
          operator_delete((void *)local_438._0_8_,(ulong)(local_438._16_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4c0._M_dataplus._M_p != paVar11) {
          operator_delete(local_4c0._M_dataplus._M_p,
                          CONCAT71(local_4c0.field_2._M_allocated_capacity._1_7_,
                                   local_4c0.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
          operator_delete(local_4a0._M_dataplus._M_p,
                          CONCAT71(local_4a0.field_2._M_allocated_capacity._1_7_,
                                   local_4a0.field_2._M_local_buf[0]) + 1);
        }
      }
      if (local_2f0 != (char *)0x0) {
        operator_delete__(local_2f0);
      }
      if (local_178 != (char *)0x0) {
        operator_delete__(local_178);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_458._M_dataplus._M_p != &local_458.field_2) {
        operator_delete(local_458._M_dataplus._M_p,
                        CONCAT71(local_458.field_2._M_allocated_capacity._1_7_,
                                 local_458.field_2._M_local_buf[0]) + 1);
      }
LAB_0052e8c0:
      in_path = *(pointer *)local_460;
      pbVar3 = *(pointer *)(local_460 + 8);
      bVar4 = true;
      if (in_path != pbVar3) {
        do {
          cmsys::SystemTools::CollapseFullPath((string *)local_238,in_path,&local_3d0);
          std::__cxx11::string::operator=((string *)in_path,(string *)local_238);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_238 + 0x10)) {
            operator_delete((void *)local_238._0_8_,(ulong)(local_228._M_allocated_capacity + 1));
          }
          in_path = in_path + 1;
        } while (in_path != pbVar3);
      }
      goto LAB_0052e92a;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_458._M_dataplus._M_p != &local_458.field_2) {
      lVar8 = CONCAT71(local_458.field_2._M_allocated_capacity._1_7_,
                       local_458.field_2._M_local_buf[0]);
      _Var12._M_p = local_458._M_dataplus._M_p;
      goto LAB_0052e0da;
    }
  }
  else {
    local_46c = 0;
    local_3f0._M_string_length = 0;
    local_3f0.field_2._M_local_buf[0] = '\0';
    local_410._M_string_length = 0;
    local_410.field_2._M_local_buf[0] = '\0';
    local_438._16_8_ = (pointer)0x0;
    local_438._0_8_ = (pointer)0x0;
    local_438._8_8_ = (pointer)0x0;
    local_468 = error;
    local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
    local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string_const&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_438,
               &this->RccExcutable_);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_438,
               local_438._8_8_,
               (this->ListOptions_).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               (this->ListOptions_).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    cmsys::SystemTools::GetFilenameName((string *)local_238,qrcFile);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_438,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_238);
    paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_238 + 0x10);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._0_8_ != paVar11) {
      operator_delete((void *)local_238._0_8_,(ulong)(local_228._M_allocated_capacity + 1));
    }
    if (verbose) {
      QuotedCommand(&local_4c0,
                    (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_438);
      local_238._0_8_ = &DAT_00000011;
      local_238._8_8_ = "Running command:\n";
      local_228._M_allocated_capacity = local_4c0._M_string_length;
      local_228._8_8_ = local_4c0._M_dataplus._M_p;
      local_3b0._8_8_ = local_3b0 + 0x10;
      local_3b0._0_8_ = &DAT_00000001;
      local_3b0[0x10] = 10;
      local_218 = &DAT_00000001;
      views._M_len = 3;
      views._M_array = (iterator)local_238;
      local_210 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3b0._8_8_;
      cmCatViews_abi_cxx11_(&local_4a0,views);
      cmSystemTools::Stdout(&local_4a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
        operator_delete(local_4a0._M_dataplus._M_p,
                        CONCAT71(local_4a0.field_2._M_allocated_capacity._1_7_,
                                 local_4a0.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4c0._M_dataplus._M_p != &local_4c0.field_2) {
        operator_delete(local_4c0._M_dataplus._M_p,
                        CONCAT71(local_4c0.field_2._M_allocated_capacity._1_7_,
                                 local_4c0.field_2._M_local_buf[0]) + 1);
      }
    }
    retVal_00 = &local_46c;
    bVar4 = cmSystemTools::RunSingleCommand
                      ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_438,&local_3f0,&local_410,retVal_00,local_3d0._M_dataplus._M_p,
                       OUTPUT_NONE,(cmDuration)0x0,Auto);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_438);
    if (bVar4 && local_46c == 0) {
      std::__cxx11::istringstream::istringstream
                ((istringstream *)local_238,(string *)&local_3f0,_S_in);
      local_4a0._M_dataplus._M_p = (pointer)&local_4a0.field_2;
      local_4a0._M_string_length = 0;
      local_4a0.field_2._M_local_buf[0] = '\0';
      while( true ) {
        cVar5 = std::ios::widen((char)*(undefined8 *)(local_238._0_8_ + -0x18) +
                                (char)(istringstream *)local_238);
        piVar7 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           ((istream *)local_238,(string *)&local_4a0,cVar5);
        if (((byte)piVar7[*(long *)(*(long *)piVar7 + -0x18) + 0x20] & 5) != 0) break;
        lVar8 = std::__cxx11::string::find((char)&local_4a0,0xd);
        if (lVar8 != -1) {
          std::__cxx11::string::substr((ulong)local_3b0,(ulong)&local_4a0);
          std::__cxx11::string::operator=((string *)&local_4a0,(string *)local_3b0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3b0._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_3b0 + 0x10)) {
            operator_delete((void *)local_3b0._0_8_,(ulong)(local_3b0._16_8_ + 1));
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4a0._M_string_length !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_460,&local_4a0);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
        operator_delete(local_4a0._M_dataplus._M_p,
                        CONCAT71(local_4a0.field_2._M_allocated_capacity._1_7_,
                                 local_4a0.field_2._M_local_buf[0]) + 1);
      }
      std::__cxx11::istringstream::~istringstream((istringstream *)local_238);
      std::ios_base::~ios_base(local_1c0);
      std::__cxx11::istringstream::istringstream
                ((istringstream *)local_238,(string *)&local_410,_S_in);
      local_4c0._M_dataplus._M_p = (pointer)&local_4c0.field_2;
      local_4c0._M_string_length = 0;
      local_4c0.field_2._M_local_buf[0] = '\0';
      do {
        do {
          cVar5 = std::ios::widen((char)*(undefined8 *)(local_238._0_8_ + -0x18) +
                                  (char)(istream *)local_238);
          piVar7 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                             ((istream *)local_238,(string *)&local_4c0,cVar5);
          uVar2 = *(uint *)(piVar7 + *(long *)(*(long *)piVar7 + -0x18) + 0x20);
          if ((uVar2 & 5) != 0) goto LAB_0052e82f;
          lVar8 = std::__cxx11::string::find((char)&local_4c0,0xd);
          if (lVar8 != -1) {
            std::__cxx11::string::substr((ulong)local_3b0,(ulong)&local_4c0);
            std::__cxx11::string::operator=((string *)&local_4c0,(string *)local_3b0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3b0._0_8_ !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_3b0 + 0x10)) {
              operator_delete((void *)local_3b0._0_8_,(ulong)(local_3b0._16_8_ + 1));
            }
          }
          local_3b0._0_8_ = local_4c0._M_string_length;
          local_3b0._8_8_ = local_4c0._M_dataplus._M_p;
          __str._M_str = "RCC: Error in";
          __str._M_len = 0xd;
          iVar6 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                            ((basic_string_view<char,_std::char_traits<char>_> *)local_3b0,0,0xd,
                             __str);
        } while (iVar6 != 0);
        if ((RccListParseOutput(std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string&)
             ::searchString_abi_cxx11_ == '\0') &&
           (iVar6 = __cxa_guard_acquire(&RccListParseOutput(std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string&)
                                         ::searchString_abi_cxx11_), iVar6 != 0)) {
          RccListParseOutput(std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string&)
          ::searchString_abi_cxx11_ = &DAT_0097cce0;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)
                     &RccListParseOutput(std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string&)
                      ::searchString_abi_cxx11_,"Cannot find file \'","");
          __cxa_atexit(std::__cxx11::string::~string,
                       &RccListParseOutput(std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string&)
                        ::searchString_abi_cxx11_,&__dso_handle);
          __cxa_guard_release(&RccListParseOutput(std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string&)
                               ::searchString_abi_cxx11_);
        }
        pcVar10 = DAT_0097ccd8;
        lVar8 = std::__cxx11::string::find
                          ((char *)&local_4c0,
                           (ulong)RccListParseOutput(std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string&)
                                  ::searchString_abi_cxx11_,0);
        if (lVar8 == -1) {
          text_02._M_str = pcVar10;
          text_02._M_len = (size_t)local_4c0._M_dataplus._M_p;
          Quoted_abi_cxx11_(&local_458,(cmQtAutoGen *)local_4c0._M_string_length,text_02);
          local_3b0._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x1d;
          local_3b0._8_8_ = "rcc lists unparsable output:\n";
          local_3b0._16_8_ = local_458._M_string_length;
          local_3b0._24_8_ = local_458._M_dataplus._M_p;
          local_4a0._M_dataplus._M_p = &DAT_00000001;
          local_4a0._M_string_length = (size_type)&local_4a0.field_2;
          local_4a0.field_2._M_local_buf[0] = '\n';
          local_390 = &DAT_00000001;
          views_05._M_len = 3;
          views_05._M_array = (iterator)local_3b0;
          local_388 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_4a0._M_string_length;
          cmCatViews_abi_cxx11_((string *)local_438,views_05);
          std::__cxx11::string::operator=((string *)local_468,(string *)local_438);
          if ((pointer)local_438._0_8_ != (pointer)(local_438 + 0x10)) {
            operator_delete((void *)local_438._0_8_,(ulong)(local_438._16_8_ + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_458._M_dataplus._M_p != &local_458.field_2) {
            paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_458.field_2._M_allocated_capacity._1_7_,
                                  local_458.field_2._M_local_buf[0]);
            _Var12._M_p = local_458._M_dataplus._M_p;
            goto LAB_0052e7a5;
          }
        }
        else {
          std::__cxx11::string::substr((ulong)local_3b0,(ulong)&local_4c0);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    (local_460,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3b0)
          ;
          paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_3b0._16_8_;
          _Var12._M_p = (pointer)local_3b0._0_8_;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3b0._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_3b0 + 0x10)) {
LAB_0052e7a5:
            operator_delete(_Var12._M_p,(ulong)(paVar11->_M_local_buf + 1));
          }
        }
      } while (lVar8 != -1);
LAB_0052e82f:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4c0._M_dataplus._M_p != &local_4c0.field_2) {
        operator_delete(local_4c0._M_dataplus._M_p,
                        CONCAT71(local_4c0.field_2._M_allocated_capacity._1_7_,
                                 local_4c0.field_2._M_local_buf[0]) + 1);
      }
      std::__cxx11::istringstream::~istringstream((istringstream *)local_238);
      std::ios_base::~ios_base(local_1c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_410._M_dataplus._M_p != &local_410.field_2) {
        operator_delete(local_410._M_dataplus._M_p,
                        CONCAT71(local_410.field_2._M_allocated_capacity._1_7_,
                                 local_410.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
        operator_delete(local_3f0._M_dataplus._M_p,
                        CONCAT71(local_3f0.field_2._M_allocated_capacity._1_7_,
                                 local_3f0.field_2._M_local_buf[0]) + 1);
      }
      if ((uVar2 & 5) != 0) goto LAB_0052e8c0;
    }
    else {
      text_01._M_str = (char *)retVal_00;
      text_01._M_len = (size_t)(qrcFile->_M_dataplus)._M_p;
      Quoted_abi_cxx11_(&local_4c0,(cmQtAutoGen *)qrcFile->_M_string_length,text_01);
      local_238._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x20;
      local_238._8_8_ = "The rcc list process failed for ";
      local_228._M_allocated_capacity = local_4c0._M_string_length;
      local_228._8_8_ = local_4c0._M_dataplus._M_p;
      local_3b0._8_8_ = local_3b0 + 0x10;
      local_3b0._0_8_ = &DAT_00000001;
      local_3b0[0x10] = 10;
      local_218 = &DAT_00000001;
      views_02._M_len = 3;
      views_02._M_array = (iterator)local_238;
      local_210 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3b0._8_8_;
      cmCatViews_abi_cxx11_(&local_4a0,views_02);
      std::__cxx11::string::operator=((string *)local_468,(string *)&local_4a0);
      paVar1 = &local_4a0.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4a0._M_dataplus._M_p != paVar1) {
        operator_delete(local_4a0._M_dataplus._M_p,
                        CONCAT71(local_4a0.field_2._M_allocated_capacity._1_7_,
                                 local_4a0.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4c0._M_dataplus._M_p != &local_4c0.field_2) {
        operator_delete(local_4c0._M_dataplus._M_p,
                        CONCAT71(local_4c0.field_2._M_allocated_capacity._1_7_,
                                 local_4c0.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3f0._M_string_length !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        local_238._0_8_ = &DAT_00000001;
        local_228._M_local_buf[0] = 10;
        local_3b0._0_8_ = local_3f0._M_string_length;
        local_3b0._8_8_ = local_3f0._M_dataplus._M_p;
        local_3b0._16_8_ = &DAT_00000001;
        views_03._M_len = 2;
        views_03._M_array = (iterator)local_3b0;
        local_3b0._24_8_ = paVar11;
        local_238._8_8_ = paVar11;
        cmCatViews_abi_cxx11_(&local_4a0,views_03);
        std::__cxx11::string::_M_append((char *)local_468,(ulong)local_4a0._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4a0._M_dataplus._M_p != paVar1) {
          operator_delete(local_4a0._M_dataplus._M_p,
                          CONCAT71(local_4a0.field_2._M_allocated_capacity._1_7_,
                                   local_4a0.field_2._M_local_buf[0]) + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_410._M_string_length !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        local_238._0_8_ = &DAT_00000001;
        local_228._M_local_buf[0] = 10;
        local_3b0._0_8_ = local_410._M_string_length;
        local_3b0._8_8_ = local_410._M_dataplus._M_p;
        local_3b0._16_8_ = &DAT_00000001;
        views_04._M_len = 2;
        views_04._M_array = (iterator)local_3b0;
        local_3b0._24_8_ = paVar11;
        local_238._8_8_ = paVar11;
        cmCatViews_abi_cxx11_(&local_4a0,views_04);
        std::__cxx11::string::_M_append((char *)local_468,(ulong)local_4a0._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4a0._M_dataplus._M_p != paVar1) {
          operator_delete(local_4a0._M_dataplus._M_p,
                          CONCAT71(local_4a0.field_2._M_allocated_capacity._1_7_,
                                   local_4a0.field_2._M_local_buf[0]) + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_410._M_dataplus._M_p != &local_410.field_2) {
        operator_delete(local_410._M_dataplus._M_p,
                        CONCAT71(local_410.field_2._M_allocated_capacity._1_7_,
                                 local_410.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
        lVar8 = CONCAT71(local_3f0.field_2._M_allocated_capacity._1_7_,
                         local_3f0.field_2._M_local_buf[0]);
        _Var12._M_p = local_3f0._M_dataplus._M_p;
LAB_0052e0da:
        operator_delete(_Var12._M_p,lVar8 + 1);
      }
    }
  }
  bVar4 = false;
LAB_0052e92a:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
    operator_delete(local_3d0._M_dataplus._M_p,local_3d0.field_2._M_allocated_capacity + 1);
  }
  return bVar4;
}

Assistant:

bool cmQtAutoGen::RccLister::list(std::string const& qrcFile,
                                  std::vector<std::string>& files,
                                  std::string& error, bool verbose) const
{
  error.clear();

  if (!cmSystemTools::FileExists(qrcFile, true)) {
    error =
      cmStrCat("The resource file ", Quoted(qrcFile), " does not exist.");
    return false;
  }

  // Run rcc list command in the directory of the qrc file with the pathless
  // qrc file name argument.  This way rcc prints relative paths.
  // This avoids issues on Windows when the qrc file is in a path that
  // contains non-ASCII characters.
  std::string const fileDir = cmSystemTools::GetFilenamePath(qrcFile);

  if (!this->RccExcutable_.empty() &&
      cmSystemTools::FileExists(this->RccExcutable_, true) &&
      !this->ListOptions_.empty()) {

    bool result = false;
    int retVal = 0;
    std::string rccStdOut;
    std::string rccStdErr;
    {
      std::vector<std::string> cmd;
      cmd.emplace_back(this->RccExcutable_);
      cm::append(cmd, this->ListOptions_);
      cmd.emplace_back(cmSystemTools::GetFilenameName(qrcFile));

      // Log command
      if (verbose) {
        cmSystemTools::Stdout(
          cmStrCat("Running command:\n", QuotedCommand(cmd), '\n'));
      }

      result = cmSystemTools::RunSingleCommand(
        cmd, &rccStdOut, &rccStdErr, &retVal, fileDir.c_str(),
        cmSystemTools::OUTPUT_NONE, cmDuration::zero(), cmProcessOutput::Auto);
    }
    if (!result || retVal) {
      error =
        cmStrCat("The rcc list process failed for ", Quoted(qrcFile), '\n');
      if (!rccStdOut.empty()) {
        error += cmStrCat(rccStdOut, '\n');
      }
      if (!rccStdErr.empty()) {
        error += cmStrCat(rccStdErr, '\n');
      }
      return false;
    }
    if (!RccListParseOutput(rccStdOut, rccStdErr, files, error)) {
      return false;
    }
  } else {
    // We can't use rcc for the file listing.
    // Read the qrc file content into string and parse it.
    {
      std::string qrcContents;
      {
        cmsys::ifstream ifs(qrcFile.c_str());
        if (ifs) {
          std::ostringstream osst;
          osst << ifs.rdbuf();
          qrcContents = osst.str();
        } else {
          error = cmStrCat("The resource file ", Quoted(qrcFile),
                           " is not readable\n");
          return false;
        }
      }
      // Parse string content
      RccListParseContent(qrcContents, files);
    }
  }

  // Convert relative paths to absolute paths
  for (std::string& entry : files) {
    entry = cmSystemTools::CollapseFullPath(entry, fileDir);
  }
  return true;
}